

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O3

void __thiscall Assimp::ColladaParser::TestOpening(ColladaParser *this,char *pName)

{
  int iVar1;
  undefined4 extraout_var;
  ostream *poVar2;
  char *local_1b0;
  string local_1a8;
  ostringstream local_188 [376];
  
  local_1b0 = pName;
  iVar1 = (*this->mReader->_vptr_IIrrXMLReader[2])();
  if ((char)iVar1 == '\0') {
    std::__cxx11::ostringstream::ostringstream(local_188);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_188,"Unexpected end of file while beginning of <",0x2b);
    poVar2 = (ostream *)
             Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
             operator<<((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                        local_188,&local_1b0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"> element.",10);
    std::__cxx11::stringbuf::str();
    ThrowException(this,&local_1a8);
  }
  iVar1 = (*this->mReader->_vptr_IIrrXMLReader[3])();
  if (iVar1 == 3) {
    iVar1 = (*this->mReader->_vptr_IIrrXMLReader[2])();
    if ((char)iVar1 == '\0') {
      std::__cxx11::ostringstream::ostringstream(local_188);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_188,"Unexpected end of file while reading beginning of <",0x33);
      poVar2 = (ostream *)
               Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
               operator<<((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                          local_188,&local_1b0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"> element.",10);
      std::__cxx11::stringbuf::str();
      ThrowException(this,&local_1a8);
    }
  }
  iVar1 = (*this->mReader->_vptr_IIrrXMLReader[3])();
  if (iVar1 == 1) {
    iVar1 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
    iVar1 = strcmp((char *)CONCAT44(extraout_var,iVar1),pName);
    if (iVar1 == 0) {
      return;
    }
  }
  std::__cxx11::ostringstream::ostringstream(local_188);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_188,"Expected start of <",0x13);
  poVar2 = (ostream *)
           Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator<<
                     ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)local_188
                      ,&local_1b0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"> element.",10);
  std::__cxx11::stringbuf::str();
  ThrowException(this,&local_1a8);
}

Assistant:

void ColladaParser::TestOpening(const char* pName)
{
    // read element start
    if (!mReader->read())
        ThrowException(format() << "Unexpected end of file while beginning of <" << pName << "> element.");
    // whitespace in front is ok, just read again if found
    if (mReader->getNodeType() == irr::io::EXN_TEXT)
        if (!mReader->read())
            ThrowException(format() << "Unexpected end of file while reading beginning of <" << pName << "> element.");

    if (mReader->getNodeType() != irr::io::EXN_ELEMENT || strcmp(mReader->getNodeName(), pName) != 0)
        ThrowException(format() << "Expected start of <" << pName << "> element.");
}